

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightedgraph.h
# Opt level: O1

DEdgeVec *
libDAI::MinSpanningTreePrims<double>(DEdgeVec *__return_storage_ptr__,WeightedGraph<double> *Graph)

{
  pointer *ppDVar1;
  size_t *psVar2;
  size_type __n;
  iterator __position;
  pair<unsigned_long,_unsigned_long> *ppVar3;
  size_t sVar4;
  pair<unsigned_long,_unsigned_long> *ppVar5;
  pointer puVar6;
  pointer pdVar7;
  _Base_ptr p_Var8;
  size_type sVar9;
  long lVar10;
  pointer pDVar11;
  long lVar12;
  _Rb_tree_header *p_Var13;
  pointer pdVar14;
  long lVar15;
  _Self __tmp;
  pair<std::_Rb_tree_iterator<unsigned_long>,_std::_Rb_tree_iterator<unsigned_long>_> pVar16;
  size_t root;
  vector<double,_std::allocator<double>_> distance_map;
  vector<double,_std::allocator<double>_> weights;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  edges;
  vector<unsigned_long,_std::allocator<unsigned_long>_> p;
  boostGraph g;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> nodes;
  pointer local_110;
  vector<double,_std::allocator<double>_> local_108;
  vector<double,_std::allocator<double>_> local_e8;
  undefined1 local_ca [2];
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  pair<unsigned_long,_unsigned_long> local_98;
  vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
  local_80;
  void *local_68;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_60;
  
  (__return_storage_ptr__->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = (Graph->
        super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
        )._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (__n != 0) {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_c8.
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pair<unsigned_long,_unsigned_long> *)0x0;
    local_c8.
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pair<unsigned_long,_unsigned_long> *)0x0;
    local_c8.
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pair<unsigned_long,_unsigned_long> *)0x0;
    local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::reserve(&local_c8,__n);
    std::vector<double,_std::allocator<double>_>::reserve
              (&local_e8,
               (Graph->
               super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
               )._M_t._M_impl.super__Rb_tree_header._M_node_count);
    p_Var8 = (Graph->
             super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
             )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var13 = &(Graph->
               super_map<libDAI::UEdge,_double,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
               )._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var8 != p_Var13) {
      do {
        if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_e8,
                     (iterator)
                     local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)&p_Var8[1]._M_left);
        }
        else {
          *local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = (double)p_Var8[1]._M_left;
          local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_98.first = *(unsigned_long *)(p_Var8 + 1);
        local_98.second = (unsigned_long)p_Var8[1]._M_parent;
        if (local_c8.
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_c8.
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
          ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                    ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                      *)&local_c8,
                     (iterator)
                     local_c8.
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_98);
        }
        else {
          (local_c8.
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->first = local_98.first;
          (local_c8.
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->second = local_98.second;
          local_c8.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_c8.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>
                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                    *)&local_60,(unsigned_long *)(p_Var8 + 1));
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>
                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                    *)&local_60,(unsigned_long *)&p_Var8[1]._M_parent);
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != p_Var13);
    }
    boost::
    adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>
    ::
    adjacency_list<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_long>*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              ((adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>
                *)&local_98,
               (__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                )local_c8.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                )local_c8.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,local_60._M_impl.super__Rb_tree_header._M_node_count
               ,0,(no_property *)&local_108);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_b0,
               (long)local_80.
                     super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_80.
                     super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_108);
    puVar6 = local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_108,
               (long)local_80.
                     super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_80.
                     super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_110);
    local_110 = (pointer)0x0;
    local_ca[0] = 0;
    boost::
    dijkstra_shortest_paths<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>,unsigned_long*,boost::dijkstra_visitor<boost::null_visitor>,unsigned_long*,boost::iterator_property_map<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,int,boost::no_property>,unsigned_long>,double,double&>,boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,int,boost::no_property>,unsigned_long>,std::less<double>,boost::detail::_project2nd<double,double>,double,double,char,boost::detail::unused_tag_type,boost::no_property>
              (0x7fefffffffffffff,0,&local_98,&local_110,&local_108,puVar6,
               local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,0,local_ca);
    if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::reserve
              (__return_storage_ptr__,local_60._M_impl.super__Rb_tree_header._M_node_count - 1);
    local_110 = (pointer)0x0;
    if (local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pdVar14 = (pointer)0x0;
      do {
        pdVar7 = pdVar14;
        if (pdVar14 !=
            (pointer)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[(long)pdVar14]) {
          local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[(long)pdVar14];
          __position._M_current =
               (__return_storage_ptr__->
               super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = pdVar14;
          if (__position._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::
            _M_realloc_insert<libDAI::DEdge>(__return_storage_ptr__,__position,(DEdge *)&local_108);
            pdVar7 = local_110;
          }
          else {
            (__position._M_current)->n1 =
                 (size_t)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
            (__position._M_current)->n2 = (size_t)pdVar14;
            ppDVar1 = &(__return_storage_ptr__->
                       super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppDVar1 = *ppDVar1 + 1;
            pdVar7 = local_110;
          }
        }
        local_110 = pdVar7;
        pdVar14 = (pointer)((long)pdVar14 + 1);
      } while (pdVar14 !=
               (pointer)((long)local_b0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_b0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3));
    }
    pVar16 = std::
             _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
             ::equal_range(&local_60,(key_type *)&local_110);
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::_M_erase_aux(&local_60,(_Base_ptr)pVar16.first._M_node,(_Base_ptr)pVar16.second._M_node);
    if ((__return_storage_ptr__->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>).
        _M_impl.super__Vector_impl_data._M_finish !=
        (__return_storage_ptr__->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>).
        _M_impl.super__Vector_impl_data._M_start) {
      lVar15 = 0;
      do {
        pDVar11 = (__return_storage_ptr__->
                  super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (lVar15 != (long)(__return_storage_ptr__->
                            super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pDVar11 >> 4) {
          lVar12 = lVar15 << 4;
          lVar10 = lVar15;
          do {
            sVar9 = std::
                    set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                    count((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)&local_60,(key_type *)((long)&pDVar11->n1 + lVar12));
            if (sVar9 == 0) {
              pVar16 = std::
                       _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       ::equal_range(&local_60,
                                     (key_type *)
                                     ((long)&((__return_storage_ptr__->
                                              super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>
                                              )._M_impl.super__Vector_impl_data._M_start)->n2 +
                                     lVar12));
              std::
              _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              ::_M_erase_aux(&local_60,(_Base_ptr)pVar16.first._M_node,
                             (_Base_ptr)pVar16.second._M_node);
              pDVar11 = (__return_storage_ptr__->
                        super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)pDVar11[lVar15].n1;
              local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)pDVar11[lVar15].n2;
              psVar2 = (size_t *)((long)&pDVar11->n1 + lVar12);
              sVar4 = psVar2[1];
              pDVar11[lVar15].n1 = *psVar2;
              pDVar11[lVar15].n2 = sVar4;
              psVar2 = (size_t *)((long)&pDVar11->n1 + lVar12);
              *psVar2 = (size_t)local_108.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start;
              psVar2[1] = (size_t)local_108.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_finish;
              lVar15 = lVar15 + 1;
              break;
            }
            lVar10 = lVar10 + 1;
            pDVar11 = (__return_storage_ptr__->
                      super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            lVar12 = lVar12 + 0x10;
          } while (lVar10 != (long)(__return_storage_ptr__->
                                   super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar11 >> 4)
          ;
        }
      } while (lVar15 != (long)(__return_storage_ptr__->
                               super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(__return_storage_ptr__->
                               super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 4);
    }
    if (local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_68 != (void *)0x0) {
      operator_delete(local_68,1);
    }
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::~vector(&local_80);
    ppVar5 = (pair<unsigned_long,_unsigned_long> *)local_98.first;
    while (ppVar5 != &local_98) {
      ppVar3 = (pair<unsigned_long,_unsigned_long> *)ppVar5->first;
      operator_delete(ppVar5,0x30);
      ppVar5 = ppVar3;
    }
    if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (double *)0x0) {
      operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_c8.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
      operator_delete(local_c8.
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree(&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

DEdgeVec MinSpanningTreePrims( const WeightedGraph<T> & Graph ) {
        DEdgeVec result;
        if( Graph.size() > 0 ) {
            using namespace boost;
            using namespace std;
            typedef adjacency_list< vecS, vecS, undirectedS, property<vertex_distance_t, int>, property<edge_weight_t, double> > boostGraph;
            typedef pair<size_t, size_t> E;

            set<size_t> nodes;
            vector<E> edges;
            vector<double> weights;
            edges.reserve( Graph.size() );
            weights.reserve( Graph.size() );
            for( typename WeightedGraph<T>::const_iterator e = Graph.begin(); e != Graph.end(); e++ ) {
                weights.push_back( e->second );
                edges.push_back( E( e->first.n1, e->first.n2 ) );
                nodes.insert( e->first.n1 );
                nodes.insert( e->first.n2 );
            }

            boostGraph g( edges.begin(), edges.end(), weights.begin(), nodes.size() );
            vector< graph_traits< boostGraph >::vertex_descriptor > p( num_vertices(g) );
            prim_minimum_spanning_tree( g, &(p[0]) );

            // Store tree edges in result
            result.reserve( nodes.size() - 1 );
            size_t root = 0;
            for( size_t i = 0; i != p.size(); i++ )
                if( p[i] != i )
                    result.push_back( DEdge( p[i], i ) );
                else
                    root = i;

            // We have to store the minimum spanning tree in the right
            // order, such that for all (i1, j1), (i2, j2) in result,
            // if j1 == i2 then (i1, j1) comes before (i2, j2) in result.
            // We do this by reordering the contents of result, effectively
            // growing the tree starting at the root. At each step, 
            // result[0..N-1] are the edges already added to the tree,
            // whereas the other elements of result still have to be added.
            // The elements of nodes are the vertices that still have to
            // be added to the tree.

            // Start with the root
            nodes.erase( root );
            size_t N = 0;

            // Iteratively add edges and nodes to the growing tree
            while( N != result.size() ) {
                for( size_t e = N; e != result.size(); e++ ) {
                    bool e1_in_tree = !nodes.count( result[e].n1 );
                    if( e1_in_tree ) {
                        nodes.erase( result[e].n2 );
                        swap( result[N], result[e] );
                        N++;
                        break;
                    }
                }
            }
        }

        return result;
    }